

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O2

String * __thiscall
String::substr(String *__return_storage_ptr__,String *this,ssize start,ssize length)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->data->len;
  if (start < 0) {
    uVar3 = 0;
    if (0 < (long)(start + uVar1)) {
      uVar3 = start + uVar1;
    }
  }
  else {
    uVar3 = start;
    if (uVar1 < (ulong)start) {
      uVar3 = uVar1;
    }
  }
  uVar2 = uVar3 + length;
  if (uVar1 <= uVar3 + length) {
    uVar2 = uVar1;
  }
  if (length < 0) {
    uVar2 = uVar1;
  }
  String(__return_storage_ptr__,this->data->str + uVar3,uVar2 - uVar3);
  return __return_storage_ptr__;
}

Assistant:

String substr(ssize start, ssize length = -1) const
  {
    if(start < 0)
    {
      start = (ssize)data->len + start;
      if(start < 0)
        start = 0;
    }
    else if((usize)start > data->len)
      start = data->len;

    usize end;
    if(length >= 0)
    {
      end = (usize)start + (usize)length;
      if(end > data->len)
        end = data->len;
    }
    else
      end = data->len;

    length = end - start;
    return String(data->str + start, length);
  }